

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O0

FT_UInt pcf_cmap_char_next(FT_CMap pcfcmap,FT_UInt32 *acharcode)

{
  FT_Face pFVar1;
  uint uVar2;
  uint local_38;
  FT_UInt result;
  FT_UInt32 w;
  FT_UInt32 h;
  FT_UInt32 j;
  FT_UInt32 i;
  FT_UInt32 charcode;
  PCF_Enc enc;
  FT_UInt32 *acharcode_local;
  FT_CMap pcfcmap_local;
  
  pFVar1 = pcfcmap[1].charmap.face;
  h = (*acharcode + 1 >> 8) - (uint)*(ushort *)((long)&pFVar1->num_faces + 4);
  w = (*acharcode + 1 & 0xff) - (uint)(ushort)pFVar1->num_faces;
  uVar2 = ((uint)*(ushort *)((long)&pFVar1->num_faces + 2) - (uint)(ushort)pFVar1->num_faces) + 1;
  local_38 = 0;
  if ((int)h < 0) {
    h = 0;
  }
  if ((int)w < 0) {
    w = 0;
  }
  for (; h < ((uint)*(ushort *)((long)&pFVar1->num_faces + 6) -
             (uint)*(ushort *)((long)&pFVar1->num_faces + 4)) + 1; h = h + 1) {
    for (; w < uVar2; w = w + 1) {
      local_38 = (uint)*(ushort *)(pFVar1->face_flags + (ulong)(h * uVar2 + w) * 2);
      if (local_38 != 0xffff) goto LAB_002fea88;
    }
    w = 0;
  }
LAB_002fea88:
  *acharcode = (h + *(ushort *)((long)&pFVar1->num_faces + 4)) * 0x100 |
               w + (ushort)pFVar1->num_faces;
  return local_38;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  pcf_cmap_char_next( FT_CMap    pcfcmap,   /* PCF_CMap */
                      FT_UInt32  *acharcode )
  {
    PCF_Enc    enc = ( (PCF_CMap)pcfcmap )->enc;
    FT_UInt32  charcode = *acharcode + 1;

    FT_UInt32  i = ( charcode >> 8   ) - enc->firstRow;
    FT_UInt32  j = ( charcode & 0xFF ) - enc->firstCol;
    FT_UInt32  h = enc->lastRow - enc->firstRow + 1;
    FT_UInt32  w = enc->lastCol - enc->firstCol + 1;

    FT_UInt  result = 0;


    /* adjust wrapped around "negative" values */
    if ( (FT_Int32)i < 0 )
      i = 0;
    if ( (FT_Int32)j < 0 )
      j = 0;

    for ( ; i < h; i++, j = 0 )
      for ( ; j < w; j++ )
      {
        result = (FT_UInt)enc->offset[i * w + j];
        if ( result != 0xFFFFU )
          goto Exit;
      }

  Exit:
    *acharcode = ( ( i + enc->firstRow ) << 8 ) | ( j + enc->firstCol );

    return result;
  }